

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

pair<long,_bool> __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar4;
  unsigned_long_long *puVar5;
  unsigned_long_long *puVar6;
  int iVar7;
  pair<long,_bool> pVar8;
  locType pos;
  long local_28;
  long lVar3;
  
  if (this->depth == 0) {
    return (pair<long,_bool>)ZEXT416(0);
  }
  lVar3 = this->root;
  puVar5 = key;
  if (this->depth < 1) {
LAB_0010b750:
    if (*(ulong *)(lVar3 + 0x328 + (long)(int)puVar5 * 8) <= *key) {
      lVar3 = *(long *)(lVar3 + (long)(int)puVar5 * 8);
      uVar4 = CONCAT71((int7)(*key >> 8),1);
      goto LAB_0010b76a;
    }
  }
  else {
    iVar7 = 0;
    local_28 = lVar3;
    do {
      iVar2 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(this->file,&local_28);
      lVar3 = CONCAT44(extraout_var,iVar2);
      uVar1 = *(uint *)(lVar3 + 0x640);
      puVar5 = (unsigned_long_long *)0x0;
      if (0 < (long)(int)uVar1) {
        puVar6 = (unsigned_long_long *)0x0;
        do {
          if (*key <= *(ulong *)(lVar3 + 0x328 + (long)puVar6 * 8)) {
            iVar2 = this->depth;
            if (iVar7 < iVar2 + -1) {
              if (*key < *(ulong *)(lVar3 + 0x328 + (long)puVar6 * 8)) {
                puVar5 = (unsigned_long_long *)((ulong)puVar6 & 0xffffffff);
                goto LAB_0010b710;
              }
              local_28 = *(long *)(lVar3 + 8 + (long)puVar6 * 8);
            }
            puVar5 = (unsigned_long_long *)((ulong)puVar6 & 0xffffffff);
            goto LAB_0010b73f;
          }
          puVar6 = (unsigned_long_long *)((long)puVar6 + 1);
        } while ((unsigned_long_long *)(long)(int)uVar1 != puVar6);
        puVar5 = (unsigned_long_long *)(ulong)uVar1;
      }
      iVar2 = this->depth;
      puVar6 = puVar5;
      if (iVar7 < iVar2 + -1) {
LAB_0010b710:
        local_28 = *(long *)(lVar3 + (long)puVar6 * 8);
      }
LAB_0010b73f:
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar2);
    if ((uint)puVar5 != uVar1) goto LAB_0010b750;
  }
  uVar4 = 0;
LAB_0010b76a:
  pVar8._8_8_ = uVar4;
  pVar8.first = lVar3;
  return pVar8;
}

Assistant:

std::pair<T, bool> find(const Key &key) {
            T ret;
            if (!depth)return std::make_pair(ret, 0);
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(key, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            if (j == x->sz || Compare()(key, x->keyvalue[j]))
                return std::make_pair(ret, false);
            ret = x->val[j];
            return std::make_pair(ret, true);
        }